

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
HFFilteredConsumer::HFFilteredConsumer
          (HFFilteredConsumer *this,HighFreqDataType *hf,int ringbufsize,hfs_data_filter_fn *fn,
          HFParsingInfo *parserargs)

{
  int iVar1;
  void *pvVar2;
  HFSubConsumer *in_RCX;
  HighFreqDataType *in_RDI;
  HighFreqDataType *in_R8;
  HighFreqDataType *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  HighFreqDataType *pHVar3;
  
  pHVar3 = in_R8;
  HighFreqDataType::HighFreqDataType((HighFreqDataType *)&stack0xffffffffffffff48,in_RDI);
  HFSubConsumer::HFSubConsumer
            (in_RCX,pHVar3,in_stack_ffffffffffffffd0,
             (consumer_queue_filter)in_stack_ffffffffffffffc8);
  HighFreqDataType::~HighFreqDataType(in_stack_ffffffffffffff00);
  (in_RDI->super_NetworkDataType)._vptr_NetworkDataType =
       (_func_int **)&PTR__HFFilteredConsumer_005d5ff0;
  *(HFSubConsumer **)&in_RDI[6].sockAddr = in_RCX;
  HFParsingInfo::HFParsingInfo
            ((HFParsingInfo *)in_R8,(HFParsingInfo *)&in_RDI[6].sockAddr._M_string_length);
  pHVar3 = in_RDI + 7;
  iVar1 = HighFreqDataType::getByteSize((HighFreqDataType *)&in_RDI->name);
  *(long *)((long)&(pHVar3->name).field_2 + 8) = (long)iVar1;
  pHVar3 = in_RDI + 7;
  pvVar2 = operator_new__(*(ulong *)((long)&in_RDI[7].name.field_2 + 8));
  *(void **)&pHVar3->origin = pvVar2;
  *(undefined4 *)((long)&in_RDI[1].name.field_2 + 8) = 3;
  return;
}

Assistant:

HFFilteredConsumer::HFFilteredConsumer(HighFreqDataType hf, int ringbufsize, hfs_data_filter_fn *fn, HFParsingInfo parserargs)
    : HFSubConsumer(hf, ringbufsize),
      filter(fn),
      args(parserargs),
      inputsize(dt.getByteSize()),
      input(new byte[inputsize])
{
    sockType = ST_FILTERED_CONSUMER;
}